

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

float ImGui::SliderCalcRatioFromValueT<long_long,double>
                (ImGuiDataType data_type,longlong v,longlong v_min,longlong v_max,float power,
                float linear_zero_pos)

{
  long lVar1;
  long lVar2;
  longlong lVar3;
  float fVar4;
  
  fVar4 = 0.0;
  if (v_max - v_min != 0) {
    lVar3 = v_max;
    if (v_min < v_max) {
      lVar3 = v_min;
    }
    lVar1 = v_max;
    if (v_max < v_min) {
      lVar1 = v_min;
    }
    if (v < lVar1) {
      lVar1 = v;
    }
    if (v < lVar3) {
      lVar1 = lVar3;
    }
    if (((data_type & 0xfffffffeU) == 8) && ((power != 1.0 || (NAN(power))))) {
      if (lVar1 < 0) {
        fVar4 = powf(1.0 - (float)((lVar1 - v_min) / ((v_max >> 0x3f & v_max) - v_min)),1.0 / power)
        ;
        fVar4 = (1.0 - fVar4) * linear_zero_pos;
      }
      else {
        lVar2 = 0;
        if (0 < v_min) {
          lVar2 = v_min;
        }
        fVar4 = powf((float)((lVar1 - lVar2) / (v_max - lVar2)),1.0 / power);
        fVar4 = fVar4 * (1.0 - linear_zero_pos) + linear_zero_pos;
      }
    }
    else {
      fVar4 = (float)((double)(lVar1 - v_min) / (double)(v_max - v_min));
    }
  }
  return fVar4;
}

Assistant:

float ImGui::SliderCalcRatioFromValueT(ImGuiDataType data_type, TYPE v, TYPE v_min, TYPE v_max, float power, float linear_zero_pos)
{
    if (v_min == v_max)
        return 0.0f;

    const bool is_power = (power != 1.0f) && (data_type == ImGuiDataType_Float || data_type == ImGuiDataType_Double);
    const TYPE v_clamped = (v_min < v_max) ? ImClamp(v, v_min, v_max) : ImClamp(v, v_max, v_min);
    if (is_power)
    {
        if (v_clamped < 0.0f)
        {
            const float f = 1.0f - (float)((v_clamped - v_min) / (ImMin((TYPE)0, v_max) - v_min));
            return (1.0f - ImPow(f, 1.0f/power)) * linear_zero_pos;
        }
        else
        {
            const float f = (float)((v_clamped - ImMax((TYPE)0, v_min)) / (v_max - ImMax((TYPE)0, v_min)));
            return linear_zero_pos + ImPow(f, 1.0f/power) * (1.0f - linear_zero_pos);
        }
    }

    // Linear slider
    return (float)((FLOATTYPE)(v_clamped - v_min) / (FLOATTYPE)(v_max - v_min));
}